

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Orphan<capnp::DynamicList> * __thiscall
capnp::Orphanage::newOrphan
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,Orphanage *this,ListSchema schema,
          uint size)

{
  BuilderArena *pBVar1;
  CapTableBuilder *pCVar2;
  ElementSize elementSize;
  uint uVar3;
  Which elementType;
  anon_union_8_2_eba6ea51_for_Type_5 aVar4;
  undefined8 uVar5;
  uint uVar6;
  Type local_78;
  Schema local_68;
  Reader local_60;
  
  aVar4 = schema.elementType.field_4;
  uVar5 = schema.elementType._0_8_;
  local_78.listDepth = schema.elementType.listDepth;
  local_78._0_8_ = uVar5;
  local_78.field_4.scopeId = aVar4.scopeId;
  if ((local_78.listDepth == '\0') && (schema.elementType.baseType == STRUCT)) {
    pBVar1 = this->arena;
    pCVar2 = this->capTable;
    local_68.raw = (RawBrandedSchema *)Type::asStruct(&local_78);
    Schema::getProto(&local_60,&local_68);
    uVar6 = 0;
    uVar3 = 0;
    if (0x7f < local_60._reader.dataSize) {
      uVar3 = (uint)*(ushort *)
                     ((long)&(((CapTableBuilder *)((long)local_60._reader.data + 8))->
                             super_CapTableReader)._vptr_CapTableReader + 6);
    }
    if (0xcf < local_60._reader.dataSize) {
      uVar6 = (uint)*(ushort *)
                     &(((CapTableBuilder *)((long)local_60._reader.data + 0x18))->
                      super_CapTableReader)._vptr_CapTableReader << 0x10;
    }
    _::OrphanBuilder::initStructList
              ((OrphanBuilder *)&local_60,pBVar1,pCVar2,size,(StructSize)(uVar6 | uVar3));
    (__return_storage_ptr__->schema).elementType.baseType = (Which)uVar5;
    (__return_storage_ptr__->schema).elementType.listDepth = SUB81(uVar5,2);
    (__return_storage_ptr__->schema).elementType.isImplicitParam = SUB81(uVar5,3);
    (__return_storage_ptr__->schema).elementType.field_3 = SUB82(uVar5,4);
    *(short *)&(__return_storage_ptr__->schema).elementType.field_0x6 = SUB82(uVar5,6);
    (__return_storage_ptr__->schema).elementType.field_4.scopeId = (uint64_t)aVar4;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_60._reader.capTable;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_60._reader.data;
    (__return_storage_ptr__->builder).location = (word *)local_60._reader.pointers;
  }
  else {
    pBVar1 = this->arena;
    pCVar2 = this->capTable;
    elementType = LIST;
    if (local_78.listDepth == '\0') {
      elementType = schema.elementType.baseType;
    }
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    _::OrphanBuilder::initList((OrphanBuilder *)&local_60,pBVar1,pCVar2,size,elementSize);
    (__return_storage_ptr__->schema).elementType.baseType = (Which)uVar5;
    (__return_storage_ptr__->schema).elementType.listDepth = SUB81(uVar5,2);
    (__return_storage_ptr__->schema).elementType.isImplicitParam = SUB81(uVar5,3);
    (__return_storage_ptr__->schema).elementType.field_3 = SUB82(uVar5,4);
    *(short *)&(__return_storage_ptr__->schema).elementType.field_0x6 = SUB82(uVar5,6);
    (__return_storage_ptr__->schema).elementType.field_4.scopeId = (uint64_t)aVar4;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_60._reader.capTable;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_60._reader.data;
    (__return_storage_ptr__->builder).location = (word *)local_60._reader.pointers;
  }
  (__return_storage_ptr__->builder).tag.content = (uint64_t)local_60._reader.segment;
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicList> Orphanage::newOrphan(ListSchema schema, uint size) const {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return Orphan<DynamicList>(schema, _::OrphanBuilder::initStructList(
        arena, capTable, bounded(size) * ELEMENTS,
        structSizeFromSchema(schema.getStructElementType())));
  } else {
    return Orphan<DynamicList>(schema, _::OrphanBuilder::initList(
        arena, capTable, bounded(size) * ELEMENTS,
        elementSizeFor(schema.whichElementType())));
  }
}